

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall PClassPlayerPawn::DeriveData(PClassPlayerPawn *this,PClass *newclass)

{
  PClass *pPVar1;
  PClass *pPVar2;
  long lVar3;
  bool bVar4;
  
  pPVar1 = RegistrationInfo.MyClass;
  if (*(PClass **)
       ((long)&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.super_PTypeBase.super_DObject + 8) == (PClass *)0x0) {
    pPVar2 = (PClass *)
             (*(code *)*(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                       (newclass);
    *(PClass **)
     ((long)&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.super_PTypeBase.super_DObject + 8) = pPVar2;
  }
  pPVar2 = *(PClass **)
            ((long)&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 8);
  bVar4 = pPVar2 != (PClass *)0x0;
  if (pPVar2 != pPVar1 && bVar4) {
    do {
      pPVar2 = pPVar2->ParentClass;
      bVar4 = pPVar2 != (PClass *)0x0;
      if (pPVar2 == pPVar1) break;
    } while (pPVar2 != (PClass *)0x0);
  }
  if (bVar4) {
    PClassActor::DeriveData(&this->super_PClassActor,newclass);
    FString::operator=((FString *)&newclass[1].FlatPointers,&this->DisplayName);
    FString::operator=((FString *)&newclass[1].Defaults,&this->SoundClass);
    FString::operator=((FString *)&newclass[1].bRuntimeClass,&this->Face);
    *(int *)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.Symbols.Symbols.Nodes = (this->InvulMode).Index;
    *(int *)((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.Symbols.Symbols + 4) =
         (this->HealingRadiusType).Index;
    *(BYTE *)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Conversions.Array = this->ColorRangeStart;
    *(BYTE *)((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                     super_PCompoundType.super_PType.Conversions.Array + 1) = this->ColorRangeEnd;
    TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::operator=
              ((TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *)
               &newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                super_PType.Conversions.Most,&this->ColorSets);
    lVar3 = 0;
    do {
      *(double *)
       ((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.Symbols.Symbols + lVar3 * 8 + 8U) = this->HexenArmor[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      FString::operator=((FString *)((long)&newclass[1].Virtuals.Most + lVar3),
                         (FString *)((long)&this->Slot[0].Chars + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x50);
    return;
  }
  __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x222,"virtual void PClassPlayerPawn::DeriveData(PClass *)");
}

Assistant:

void PClassPlayerPawn::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	Super::DeriveData(newclass);
	PClassPlayerPawn *newp = static_cast<PClassPlayerPawn *>(newclass);
	size_t i;

	newp->DisplayName = DisplayName;
	newp->SoundClass = SoundClass;
	newp->Face = Face;
	newp->InvulMode = InvulMode;
	newp->HealingRadiusType = HealingRadiusType;
	newp->ColorRangeStart = ColorRangeStart;
	newp->ColorRangeEnd = ColorRangeEnd;
	newp->ColorSets = ColorSets;
	for (i = 0; i < countof(HexenArmor); ++i)
	{
		newp->HexenArmor[i] = HexenArmor[i];
	}
	for (i = 0; i < countof(Slot); ++i)
	{
		newp->Slot[i] = Slot[i];
	}
}